

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void outlet_free(_outlet *x)

{
  _outlet *p_Var1;
  _outlet **pp_Var2;
  _outlet *p_Var3;
  
  p_Var1 = x->o_owner->te_outlet;
  if (p_Var1 == x) {
    pp_Var2 = &x->o_owner->te_outlet;
  }
  else {
    do {
      p_Var3 = p_Var1;
      if (p_Var3 == (_outlet *)0x0) goto LAB_0016f3b3;
      p_Var1 = p_Var3->o_next;
    } while (p_Var3->o_next != x);
    pp_Var2 = &p_Var3->o_next;
  }
  *pp_Var2 = x->o_next;
LAB_0016f3b3:
  freebytes(x,0x20);
  return;
}

Assistant:

void outlet_free(t_outlet *x)
{
    t_object *y = x->o_owner;
    t_outlet *x2;
    if (y->ob_outlet == x) y->ob_outlet = x->o_next;
    else for (x2 = y->ob_outlet; x2; x2 = x2->o_next)
        if (x2->o_next == x)
    {
        x2->o_next = x->o_next;
        break;
    }
    t_freebytes(x, sizeof(*x));
}